

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O2

void clone_free(t_clone *x)

{
  t_copy *ptVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  ptVar1 = x->x_vec;
  if (ptVar1 != (t_copy *)0x0) {
    if ((pd_maininstance.pd_gui)->i_reloadingabstraction == (_glist *)0x0) {
      iVar3 = -1;
    }
    else {
      uVar5 = 0;
      uVar2 = (ulong)(uint)x->x_n;
      if (x->x_n < 1) {
        uVar2 = uVar5;
      }
      uVar4 = 0xffffffffffffffff;
      for (; iVar3 = (int)uVar4, uVar2 != uVar5; uVar5 = uVar5 + 1) {
        if (ptVar1->c_gl == (pd_maininstance.pd_gui)->i_reloadingabstraction) {
          uVar4 = uVar5;
        }
        uVar4 = uVar4 & 0xffffffff;
        ptVar1 = ptVar1 + 1;
      }
    }
    lVar6 = 0;
    lVar7 = 0;
    while( true ) {
      if (x->x_n <= lVar7) break;
      canvas_closebang(*(_glist **)((long)&x->x_vec->c_gl + lVar6 * 2));
      pd_free(*(t_pd **)((long)&x->x_vec->c_gl + lVar6 * 2));
      freebytes(*(void **)((long)x->x_outvec + lVar6),(long)x->x_nout * 0x18);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 8;
    }
    freebytes(x->x_vec,(long)x->x_n << 4);
    freebytes(x->x_argv,(long)x->x_argc << 4);
    freebytes(x->x_invec,(long)x->x_nin * 0x18);
    freebytes(x->x_outvec,(long)x->x_n << 3);
    clone_voicetovis = iVar3;
  }
  return;
}

Assistant:

static void clone_free(t_clone *x)
{
    if (x->x_vec)
    {
        int i, voicetovis = -1;
        if (THISGUI->i_reloadingabstraction)
        {
            for (i = 0; i < x->x_n; i++)
                if (x->x_vec[i].c_gl == THISGUI->i_reloadingabstraction)
                    voicetovis = i;
        }
        for (i = 0; i < x->x_n; i++)
        {
            canvas_closebang(x->x_vec[i].c_gl);
            pd_free(&x->x_vec[i].c_gl->gl_pd);
            t_freebytes(x->x_outvec[i],
                x->x_nout * sizeof(*x->x_outvec[i]));
        }
        t_freebytes(x->x_vec, x->x_n * sizeof(*x->x_vec));
        t_freebytes(x->x_argv, x->x_argc * sizeof(*x->x_argv));
        t_freebytes(x->x_invec, x->x_nin * sizeof(*x->x_invec));
        t_freebytes(x->x_outvec, x->x_n * sizeof(*x->x_outvec));
        clone_voicetovis = voicetovis;
    }
}